

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

Vec_Int_t * Io_ReadFins(Abc_Ntk_t *pNtk,char *pFileName,int fVerbose)

{
  Abc_Ntk_t *p;
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  char *pcVar5;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  char *pToken;
  FILE *pFile;
  int local_448;
  int nLines;
  int fFound;
  int iObj;
  int Type;
  int i;
  Vec_Int_t *vPairs;
  Vec_Int_t *vMap;
  Abc_Nam_t *pNam;
  Abc_Obj_t *pObj;
  char Buffer [1000];
  Mio_Library_t *pLib;
  int fVerbose_local;
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  Buffer._992_8_ = pNtk->pManFunc;
  _Type = (Abc_Ntk_t *)0x0;
  pFile._4_4_ = 1;
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open input file \"%s\" for reading.\n",pFileName);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    vMap = (Vec_Int_t *)Abc_NamStart(1000,10);
    vPairs = Vec_IntAlloc(1000);
    Vec_IntPush(vPairs,-1);
    for (iObj = 0; iVar3 = iObj, iVar2 = Vec_PtrSize(pNtk->vObjs), iVar3 < iVar2; iObj = iObj + 1) {
      pNam = (Abc_Nam_t *)Abc_NtkObj(pNtk,iObj);
      if ((pNam != (Abc_Nam_t *)0x0) &&
         ((iVar3 = Abc_ObjIsCi((Abc_Obj_t *)pNam), iVar3 != 0 ||
          (iVar3 = Abc_ObjIsNode((Abc_Obj_t *)pNam), iVar3 != 0)))) {
        pVVar1 = vMap;
        pcVar5 = Abc_ObjName((Abc_Obj_t *)pNam);
        Abc_NamStrFindOrAdd((Abc_Nam_t *)pVVar1,pcVar5,&local_448);
        pVVar1 = vPairs;
        if (local_448 != 0) {
          pcVar5 = Abc_ObjName((Abc_Obj_t *)pNam);
          printf("The same name \"%s\" appears twice among CIs and internal nodes.\n",pcVar5);
          goto LAB_002f421f;
        }
        uVar4 = Abc_ObjId((Abc_Obj_t *)pNam);
        Vec_IntPush(pVVar1,uVar4);
      }
    }
    iVar3 = Vec_IntSize(vPairs);
    iVar2 = Abc_NamObjNumMax((Abc_Nam_t *)vMap);
    if (iVar3 != iVar2) {
      __assert_fail("Vec_IntSize(vMap) == Abc_NamObjNumMax(pNam)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                    ,0xc3,"Vec_Int_t *Io_ReadFins(Abc_Ntk_t *, char *, int)");
    }
    _Type = (Abc_Ntk_t *)Vec_IntAlloc(1000);
    Vec_IntPushTwo((Vec_Int_t *)_Type,-1,-1);
    while ((pcVar5 = fgets((char *)&pObj,1000,__stream), pcVar5 != (char *)0x0 &&
           (pcVar5 = strtok((char *)&pObj," \n\r\t"), pcVar5 != (char *)0x0))) {
      iVar3 = pFile._4_4_ + 1;
      iVar2 = atoi(pcVar5);
      if (pFile._4_4_ != iVar2) {
        printf("Line numbers are not consecutive. Quitting.\n");
        Vec_IntFreeP((Vec_Int_t **)&Type);
        goto LAB_002f421f;
      }
      pcVar5 = strtok((char *)0x0," \n\r\t");
      nLines = Abc_NamStrFind((Abc_Nam_t *)vMap,pcVar5);
      pFile._4_4_ = iVar3;
      if (nLines == 0) {
        printf("Cannot find object with name \"%s\".\n",pcVar5);
      }
      else {
        pcVar5 = strtok((char *)0x0," \n\r\t");
        iVar3 = Abc_NtkIsMappedLogic(pNtk);
        if (iVar3 == 0) {
          fFound = Io_ReadFinType(pcVar5);
        }
        else {
          iVar3 = strcmp(pcVar5,"SA0");
          if (((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"SA1"), iVar3 == 0)) ||
             (iVar3 = strcmp(pcVar5,"NEG"), iVar3 == 0)) {
            fFound = Io_ReadFinType(pcVar5);
          }
          else {
            fFound = Io_ReadFinTypeMapped((Mio_Library_t *)Buffer._992_8_,pcVar5);
          }
        }
        p = _Type;
        if (fFound == -100) {
          pAVar6 = Abc_NtkObj(pNtk,nLines);
          pcVar7 = Abc_ObjName(pAVar6);
          printf("Cannot read type \"%s\" of object \"%s\".\n",pcVar5,pcVar7);
        }
        else {
          iVar3 = Vec_IntEntry(vPairs,nLines);
          Vec_IntPushTwo((Vec_Int_t *)p,iVar3,fFound);
        }
      }
    }
    iVar3 = Vec_IntSize((Vec_Int_t *)_Type);
    if (iVar3 != pFile._4_4_ * 2) {
      __assert_fail("Vec_IntSize(vPairs) == 2 * nLines",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                    ,0xed,"Vec_Int_t *Io_ReadFins(Abc_Ntk_t *, char *, int)");
    }
    printf("Finished reading %d lines from the fault list file \"%s\".\n",(ulong)(pFile._4_4_ - 1),
           pFileName);
    if (fVerbose != 0) {
      for (iObj = 2; iVar3 = iObj + 1, iVar2 = Vec_IntSize((Vec_Int_t *)_Type), iVar3 < iVar2;
          iObj = iObj + 2) {
        nLines = Vec_IntEntry((Vec_Int_t *)_Type,iObj);
        fFound = Vec_IntEntry((Vec_Int_t *)_Type,iObj + 1);
        uVar4 = iObj / 2;
        pAVar6 = Abc_NtkObj(pNtk,nLines);
        pcVar5 = Abc_ObjName(pAVar6);
        pcVar7 = Io_WriteFinType(fFound);
        printf("%-10d%-10s%-10s\n",(ulong)uVar4,pcVar5,pcVar7);
      }
    }
LAB_002f421f:
    Vec_IntFree(vPairs);
    Abc_NamDeref((Abc_Nam_t *)vMap);
    fclose(__stream);
    pNtk_local = _Type;
  }
  return (Vec_Int_t *)pNtk_local;
}

Assistant:

Vec_Int_t * Io_ReadFins( Abc_Ntk_t * pNtk, char * pFileName, int fVerbose )
{
    Mio_Library_t * pLib = (Mio_Library_t *)pNtk->pManFunc;
    char Buffer[1000];
    Abc_Obj_t * pObj;
    Abc_Nam_t * pNam;
    Vec_Int_t * vMap; 
    Vec_Int_t * vPairs = NULL;
    int i, Type, iObj, fFound, nLines = 1;
    FILE * pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file \"%s\" for reading.\n", pFileName );
        return NULL;
    }
    // map CI/node names into their IDs
    pNam = Abc_NamStart( 1000, 10 );
    vMap = Vec_IntAlloc( 1000 );
    Vec_IntPush( vMap, -1 );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( !Abc_ObjIsCi(pObj) && !Abc_ObjIsNode(pObj) )
            continue;
        Abc_NamStrFindOrAdd( pNam, Abc_ObjName(pObj), &fFound );
        if ( fFound )
        {
            printf( "The same name \"%s\" appears twice among CIs and internal nodes.\n", Abc_ObjName(pObj) );
            goto finish;
        }
        Vec_IntPush( vMap, Abc_ObjId(pObj) );
    }
    assert( Vec_IntSize(vMap) == Abc_NamObjNumMax(pNam) );
    // read file lines
    vPairs = Vec_IntAlloc( 1000 );
    Vec_IntPushTwo( vPairs, -1, -1 );
    while ( fgets(Buffer, 1000, pFile) != NULL )
    {
        // read line number
        char * pToken = strtok( Buffer, " \n\r\t" );
        if ( pToken == NULL )
            break;
        if ( nLines++ != atoi(pToken) )
        {
            printf( "Line numbers are not consecutive. Quitting.\n" );
            Vec_IntFreeP( &vPairs );
            goto finish;
        }
        // read object name and find its ID
        pToken = strtok( NULL, " \n\r\t" );
        iObj = Abc_NamStrFind( pNam, pToken );
        if ( !iObj )
        {
            printf( "Cannot find object with name \"%s\".\n", pToken );
            continue;
        }
        // read type
        pToken = strtok( NULL, " \n\r\t" );
        if ( Abc_NtkIsMappedLogic(pNtk) )
        {
            if ( !strcmp(pToken, "SA0") || !strcmp(pToken, "SA1") || !strcmp(pToken, "NEG") )
                Type = Io_ReadFinType( pToken );
            else
                Type = Io_ReadFinTypeMapped( pLib, pToken );
        }
        else
            Type = Io_ReadFinType( pToken );
        if ( Type == ABC_FIN_NONE )
        {
            printf( "Cannot read type \"%s\" of object \"%s\".\n", pToken, Abc_ObjName(Abc_NtkObj(pNtk, iObj)) );
            continue;
        }
        Vec_IntPushTwo( vPairs, Vec_IntEntry(vMap, iObj), Type );
    }
    assert( Vec_IntSize(vPairs) == 2 * nLines );
    printf( "Finished reading %d lines from the fault list file \"%s\".\n", nLines - 1, pFileName );

    // verify the reader by printing the results
    if ( fVerbose )
        Vec_IntForEachEntryDoubleStart( vPairs, iObj, Type, i, 2 )
            printf( "%-10d%-10s%-10s\n", i/2, Abc_ObjName(Abc_NtkObj(pNtk, iObj)), Io_WriteFinType(Type) );

finish:
    Vec_IntFree( vMap );
    Abc_NamDeref( pNam );
    fclose( pFile );
    return vPairs;
}